

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O2

Optional<unsigned_int> __thiscall
llvm::MCRegisterInfo::getLLVMRegNum(MCRegisterInfo *this,uint RegNum,bool isEH)

{
  DwarfLLVMRegPair *pDVar1;
  uint uVar2;
  DwarfLLVMRegPair *pDVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  OptionalStorage<unsigned_int,_true> OVar6;
  DwarfLLVMRegPair Key;
  
  pDVar1 = (&this->Dwarf2LRegs)[CONCAT71(in_register_00000011,isEH) & 0xffffffff];
  OVar6.field_0 = (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
  OVar6.hasVal = false;
  OVar6._5_3_ = 0;
  if (pDVar1 != (DwarfLLVMRegPair *)0x0) {
    uVar2 = (&this->Dwarf2LRegsSize)[isEH];
    pDVar3 = std::
             __lower_bound<llvm::MCRegisterInfo::DwarfLLVMRegPair_const*,llvm::MCRegisterInfo::DwarfLLVMRegPair,__gnu_cxx::__ops::_Iter_less_val>
                       (pDVar1,pDVar1 + uVar2);
    if ((pDVar3 == pDVar1 + uVar2) || (pDVar3->FromReg != RegNum)) {
      uVar5 = 0;
      uVar2 = 0;
      uVar4 = 0;
    }
    else {
      uVar5 = pDVar3->ToReg & 0xff;
      uVar2 = pDVar3->ToReg & 0xffffff00;
      uVar4 = 0x100000000;
    }
    OVar6 = (OptionalStorage<unsigned_int,_true>)((uVar5 | uVar2) | uVar4);
  }
  return (Optional<unsigned_int>)OVar6;
}

Assistant:

Optional<unsigned> MCRegisterInfo::getLLVMRegNum(unsigned RegNum,
                                                 bool isEH) const {
  const DwarfLLVMRegPair *M = isEH ? EHDwarf2LRegs : Dwarf2LRegs;
  unsigned Size = isEH ? EHDwarf2LRegsSize : Dwarf2LRegsSize;

  if (!M)
    return None;
  DwarfLLVMRegPair Key = { RegNum, 0 };
  const DwarfLLVMRegPair *I = std::lower_bound(M, M+Size, Key);
  if (I != M + Size && I->FromReg == RegNum)
    return I->ToReg;
  return None;
}